

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlpperf.c
# Opt level: O2

void * benchmark_thread(void *param)

{
  uint uVar1;
  FILE *__stream;
  int iVar2;
  long lVar3;
  uintptr_t current;
  int *piVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  code *local_10e8;
  timeval end;
  timeval start;
  cpu_set_t target_cpu_set;
  char buf [4096];
  
  target_cpu_set.__bits[0] = 0;
  target_cpu_set.__bits[1] = 0;
  target_cpu_set.__bits[2] = 0;
  target_cpu_set.__bits[3] = 0;
  target_cpu_set.__bits[4] = 0;
  target_cpu_set.__bits[5] = 0;
  target_cpu_set.__bits[6] = 0;
  target_cpu_set.__bits[7] = 0;
  target_cpu_set.__bits[8] = 0;
  target_cpu_set.__bits[9] = 0;
  target_cpu_set.__bits[10] = 0;
  target_cpu_set.__bits[0xb] = 0;
  target_cpu_set.__bits[0xc] = 0;
  target_cpu_set.__bits[0xd] = 0;
  target_cpu_set.__bits[0xe] = 0;
  target_cpu_set.__bits[0xf] = 0;
  uVar1 = *(uint *)((long)param + 0x28);
  if (uVar1 < 0x400) {
    target_cpu_set.__bits[uVar1 >> 6] =
         target_cpu_set.__bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
  }
  pthread_setaffinity_np(*(pthread_t *)((long)param + 8),0x80,(cpu_set_t *)&target_cpu_set);
  fprintf(_stdout,"%s: start on cpu %d, address %#lx, size %lu, len %lu\n","benchmark_thread",
          (ulong)*(uint *)((long)param + 0x28),*(undefined8 *)((long)param + 0x30),
          *(undefined8 *)((long)param + 0x38),*(undefined8 *)(*param + 0x20));
  iVar2 = *(int *)(*param + 0xc);
  if (iVar2 == 0) {
    local_10e8 = dma_read;
    uVar7 = 0x800;
  }
  else {
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:ERR: invalid direction on cpu %d\n","benchmark_thread",
              (ulong)*(uint *)((long)param + 0x28));
      return (void *)0x0;
    }
    local_10e8 = dma_write;
    uVar7 = 0x100;
  }
  current = *(uintptr_t *)((long)param + 0x30);
  uVar9 = *(ulong *)(*param + 0x20);
  while( true ) {
    if (caught_signal != '\0') {
      return (void *)0x0;
    }
    if (debug == '\x01') {
      fprintf(_stdout,"%s:DEBUG: DMA to %#lx, cpu %d\n","benchmark_thread",current,
              (ulong)*(uint *)((long)param + 0x28));
    }
    uVar8 = uVar7;
    if (uVar9 < uVar7) {
      uVar8 = uVar9;
    }
    if (tlpperf->latency_mode != 0) {
      gettimeofday((timeval *)&start,(__timezone_ptr_t)0x0);
    }
    lVar3 = (*local_10e8)((long)param + 0x10,current,buf,uVar8);
    if (tlpperf->latency_mode != 0) {
      gettimeofday((timeval *)&end,(__timezone_ptr_t)0x0);
    }
    __stream = _stderr;
    if (lVar3 < 0) break;
    if (tlpperf->latency_mode != 0) {
      lVar6 = end.tv_usec + 1000000;
      if (start.tv_usec <= end.tv_usec) {
        lVar6 = end.tv_usec;
      }
      printf("latency: cpu on %d, %lu usec\n",(ulong)*(uint *)((long)param + 0x28),
             (lVar6 - start.tv_usec) +
             ((end.tv_sec - start.tv_sec) - (ulong)(end.tv_usec < start.tv_usec)) * 1000000);
    }
    *(long *)((long)param + 0x40) = *(long *)((long)param + 0x40) + 1;
    *(long *)((long)param + 0x48) = *(long *)((long)param + 0x48) + lVar3;
    current = next_target_addr(current,*(uintptr_t *)((long)param + 0x30),
                               *(long *)((long)param + 0x38) + *(uintptr_t *)((long)param + 0x30),
                               *(size_t *)(*param + 0x20),*(int *)(*param + 0x30));
    uVar9 = uVar9 - lVar3;
    if (uVar9 == 0) {
      uVar9 = *(ulong *)(*param + 0x20);
    }
    if ((0 < *(int *)((long)param + 0x50)) &&
       (iVar2 = *(int *)((long)param + 0x50) + -1, *(int *)((long)param + 0x50) = iVar2, iVar2 == 0)
       ) {
      return (void *)0x0;
    }
    if (*(int *)(*param + 0x3c) != 0) {
      usleep(*(int *)(*param + 0x3c) * 1000);
    }
  }
  uVar1 = *(uint *)((long)param + 0x28);
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  fprintf(__stream,"dma error on cpu %d. addr %#lx, len %lu: %s\n",(ulong)uVar1,current,uVar8,pcVar5
         );
  return (void *)0x0;
}

Assistant:

void *benchmark_thread(void *param)
{
	struct tlpperf_thread *th = param;
	uintptr_t addr;
	size_t dma_len, one_dma_len, len;
	ssize_t ret;
	char buf[MRRS * 2];	/* x2 is just a buffer */
	cpu_set_t target_cpu_set;
	ssize_t (*dma)(struct nettlp *nt, uintptr_t addr,
		       void *buf, size_t count);
	struct timeval start, end;	/* for latency mode */

	CPU_ZERO(&target_cpu_set);
	CPU_SET(th->cpu, &target_cpu_set);
	pthread_setaffinity_np(th->tid, sizeof(cpu_set_t), &target_cpu_set);

	pr_info("start on cpu %d, address %#lx, size %lu, len %lu\n",
		th->cpu, th->region_addr, th->region_size, th->t->dma_len);

	switch (th->t->direction) {
	case DMA_DIRECTION_READ:
		one_dma_len = MRRS;
		dma = dma_read;
		break;
	case DMA_DIRECTION_WRITE:
		one_dma_len = MPS;
		dma = dma_write;
		break;
	default:
		pr_err("invalid direction on cpu %d\n", th->cpu);
		return NULL;
	}

	addr = th->region_addr;
	dma_len = th->t->dma_len;

	while (1) {

		if (caught_signal)
			break;

		pr_debug("DMA to %#lx, cpu %d\n", addr, th->cpu);

		len = dma_len < one_dma_len ? dma_len : one_dma_len;

		if (tlpperf->latency_mode)
			gettimeofday(&start, NULL);

		ret = dma(&th->nt, addr, buf, len);

		if (tlpperf->latency_mode)
			gettimeofday(&end, NULL);

		if (ret < 0) {
			fprintf(stderr,
				"dma error on cpu %d. "
				"addr %#lx, len %lu: %s\n",
				th->cpu, addr, len, strerror(errno));
			return NULL;
			goto next;
		}

		if (tlpperf->latency_mode) {
			printf("latency: cpu on %d, %lu usec\n",
			       th->cpu, get_usec_elapsed(start, end));
		}

		th->ntrans++;
		th->nbytes += ret;
		dma_len -= ret;
		addr = next_target_addr(addr, th->region_addr,
					th->region_addr + th->region_size,
					th->t->dma_len, th->t->pattern);

		if (dma_len == 0) {
			/* 1 transaction finished */
			dma_len = th->t->dma_len;
		}

	next:
		if (th->count > 0) {
			th->count--;
			if (th->count == 0)
				break;
		}

		if (th->t->interval)
			usleep(th->t->interval * 1000);
	}

	return NULL;
}